

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O1

int ReadPNM(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  uint uVar4;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  int iVar12;
  uint uVar13;
  uint8_t *puVar14;
  char *__format;
  int iVar15;
  size_t sVar16;
  size_t off;
  ulong uVar17;
  uint uVar18;
  uint64_t uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char out_1 [1025];
  char out [1025];
  undefined4 local_8ec;
  ulong local_8e8;
  uint8_t *local_8e0;
  ulong local_8d8;
  undefined1 local_8d0 [16];
  undefined8 local_8c0;
  uint local_8b8;
  int local_8ac;
  ulong local_8a8;
  uint8_t *local_8a0;
  uint64_t local_898;
  uint8_t *local_890;
  undefined1 local_888 [16];
  WebPPicture *local_878;
  size_t local_870;
  long local_868;
  size_t local_860;
  long local_858;
  ulong local_850;
  uint8_t local_848 [4];
  char cStack_844;
  char cStack_843;
  char cStack_842;
  char cStack_841;
  char cStack_840;
  char cStack_83f;
  char cStack_83e;
  char cStack_83d;
  char cStack_83c;
  char cStack_83b;
  char cStack_83a;
  char cStack_839;
  char cStack_838;
  char cStack_837;
  char cStack_836;
  char cStack_835;
  char cStack_834;
  char cStack_833;
  char cStack_832;
  char cStack_831;
  char cStack_830;
  uint8_t local_438 [1032];
  
  local_8e0 = data;
  local_8d8 = data_size;
  if (2 < data_size && data != (uint8_t *)0x0) {
    local_8b8 = 0;
    local_8d0 = (undefined1  [16])0x0;
    local_8c0 = 0xffffffff00000000;
    off = 1;
    uVar8 = 0;
    do {
      uVar5 = data[off - 1];
      local_438[uVar8] = uVar5;
      local_8a8 = uVar8;
      if ((uVar5 == '\n') ||
         (local_8a8 = uVar8 + 1, bVar20 = 0x3fe < uVar8, uVar8 = local_8a8,
         data_size <= off || bVar20)) {
        if (data_size <= off) goto LAB_001068fc;
        if (local_8a8 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          if (local_438[0] != '#') goto LAB_001068fc;
        }
      }
      off = off + 1;
    } while( true );
  }
LAB_00106cff:
  sVar16 = 0;
LAB_00106d02:
  if (sVar16 == 0) {
    ReadPNM_cold_7();
  }
  else if (local_8c0._4_4_ - 8U < 0xfffffffd) {
    __format = "Unsupported P%d PNM format.\n";
LAB_001070c7:
    fprintf(_stderr,__format);
  }
  else if (pic != (WebPPicture *)0x0) {
    lVar9 = (long)(int)local_8d0._0_4_;
    if ((lVar9 < 0x4000) && ((int)local_8d0._4_4_ < 0x4000)) {
      if (data_size < (long)(int)local_8d0._8_4_ * (int)local_8d0._4_4_ * lVar9 + sVar16) {
        __format = "Truncated PNM file (P%d).\n";
        goto LAB_001070c7;
      }
      local_8ac = (uint)local_8c0;
      bVar20 = (local_8d0._12_4_ & 0xfffffffd) != 1;
      uVar19 = ((ulong)(keep_alpha != 0 && bVar20) + 3) * lVar9;
      iVar6 = ImgIoUtilCheckSizeArgumentsOverflow(uVar19,(long)(int)local_8d0._4_4_);
      if (iVar6 != 0) {
        uVar7 = local_8d0._4_4_;
        lVar9 = (long)(int)local_8d0._4_4_;
        local_898 = uVar19;
        puVar10 = (uint8_t *)malloc(uVar19 * lVar9);
        if (puVar10 != (uint8_t *)0x0) {
          uVar19 = local_898;
          local_8a0 = puVar10;
          local_878 = pic;
          if (0 < (int)uVar7) {
            local_8e8 = (ulong)(uint)local_8d0._0_4_;
            uVar3 = local_8d0._12_4_;
            local_858 = (long)(int)(local_8d0._8_4_ * local_8d0._0_4_);
            uVar4 = (uint)local_8c0;
            bVar21 = (uint)local_8c0 != 0xff;
            bVar22 = local_8d0._12_4_ == 3;
            bVar1 = (int)local_8d0._12_4_ < 3;
            local_888._0_4_ = (int)(uint)local_8c0 / 2;
            uVar18 = local_8d0._12_4_ * local_8d0._0_4_;
            bVar23 = local_8d0._12_4_ == 2;
            bVar2 = local_8d0._12_4_ != 4;
            local_870 = (size_t)(int)uVar18;
            puVar14 = data + sVar16;
            local_890 = puVar10 + 2;
            uVar8 = 0;
            iVar6 = local_8ac;
            local_868 = lVar9;
            do {
              local_850 = uVar8;
              if (bVar1 || bVar21) {
                if (0 < (int)uVar18) {
                  uVar8 = 0;
                  iVar15 = 0;
                  do {
                    if (iVar6 < 0x100) {
                      uVar7 = (uint)puVar14[uVar8];
                    }
                    else {
                      uVar7 = (uint)(ushort)(*(ushort *)(puVar14 + uVar8 * 2) << 8 |
                                            *(ushort *)(puVar14 + uVar8 * 2) >> 8);
                    }
                    if (uVar4 != 0xff) {
                      uVar7 = (uVar7 * 0xff + local_888._0_4_) / uVar4;
                    }
                    if (0xfe < uVar7) {
                      uVar7 = 0xff;
                    }
                    uVar5 = (uint8_t)uVar7;
                    if ((int)uVar3 < 3) {
                      if ((uVar3 != 1 & (byte)uVar8) == 0) {
                        puVar10[(long)iVar15 + 2] = uVar5;
                        puVar10[(long)iVar15 + 1] = uVar5;
                        iVar12 = 3;
                        goto LAB_00106f9b;
                      }
                      if (bVar23 && keep_alpha != 0) goto LAB_00106f96;
                    }
                    else if ((bVar2 || keep_alpha != 0) || (~(uint)uVar8 & 3) != 0) {
LAB_00106f96:
                      iVar12 = 1;
LAB_00106f9b:
                      puVar10[iVar15] = uVar5;
                      iVar15 = iVar15 + iVar12;
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar18 != uVar8);
                }
              }
              else if (bVar22 || keep_alpha != 0) {
                local_860 = sVar16;
                memcpy(puVar10,data + sVar16,local_870);
                sVar16 = local_860;
                uVar19 = local_898;
                lVar9 = local_868;
                iVar6 = local_8ac;
              }
              else if (0 < (int)local_8e8) {
                uVar8 = 0;
                puVar11 = local_890;
                do {
                  puVar11[-2] = puVar14[uVar8 * 4];
                  puVar11[-1] = puVar14[uVar8 * 4 + 1];
                  *puVar11 = puVar14[uVar8 * 4 + 2];
                  uVar8 = uVar8 + 1;
                  puVar11 = puVar11 + 3;
                } while (local_8e8 != uVar8);
              }
              sVar16 = sVar16 + local_858;
              puVar10 = puVar10 + uVar19;
              uVar13 = (int)local_850 + 1;
              uVar8 = (ulong)uVar13;
              puVar14 = puVar14 + local_858;
              local_890 = local_890 + uVar19;
              uVar7 = (uint)lVar9;
            } while (uVar13 != uVar7);
          }
          puVar10 = local_8a0;
          local_878->width = local_8d0._0_4_;
          local_878->height = uVar7;
          if (keep_alpha != 0 && bVar20) {
            iVar6 = WebPPictureImportRGBA(local_878,local_8a0,(int)uVar19);
          }
          else {
            iVar6 = WebPPictureImportRGB(local_878,local_8a0,(int)uVar19);
          }
          uVar7 = (uint)(iVar6 != 0);
          goto LAB_0010705b;
        }
      }
    }
    else {
      fprintf(_stderr,"Invalid %dx%d dimension for PNM\n",(ulong)(uint)local_8d0._0_4_);
    }
  }
  puVar10 = (uint8_t *)0x0;
  uVar7 = 0;
LAB_0010705b:
  free(puVar10);
  return uVar7;
LAB_001068fc:
  local_438[local_8a8] = '\0';
  iVar6 = __isoc99_sscanf(local_438,"P%d");
  if (iVar6 != 1) goto LAB_00106cff;
  if (local_8c0._4_4_ == 7) {
    local_8e8 = CONCAT44(local_8e8._4_4_,0xffffffff);
    local_888._8_8_ = 0x4143535941524720;
    local_888._0_8_ = 0x455059544c505554;
LAB_00106982:
    do {
      if (off < local_8d8) {
        uVar8 = 0;
        do {
          uVar17 = uVar8;
          uVar5 = local_8e0[uVar17 + off];
          local_848[uVar17] = uVar5;
          uVar8 = uVar17;
          if ((uVar5 == '\n') || (uVar8 = uVar17 + 1, 0x3fe < uVar17)) break;
        } while (off + 1 + uVar17 < local_8d8);
        off = off + uVar17 + 1;
      }
      else {
        uVar8 = 0;
      }
    } while ((off < local_8d8) && ((uVar8 == 0 || (local_848[0] == '#'))));
    local_848[uVar8] = '\0';
    if (off == 0) goto LAB_00107158;
    iVar6 = __isoc99_sscanf(local_848,"WIDTH %d",&local_8ec);
    if (iVar6 != 1) {
      iVar6 = __isoc99_sscanf(local_848,"HEIGHT %d",&local_8ec);
      if (iVar6 == 1) {
        if ((local_8b8 & 2) != 0) {
          ReadPNM_cold_5();
          goto LAB_00107158;
        }
        local_8b8 = local_8b8 | 2;
        local_8d0._4_4_ = local_8ec;
      }
      else {
        iVar6 = __isoc99_sscanf(local_848,"DEPTH %d",&local_8ec);
        if (iVar6 == 1) {
          if ((local_8b8 & 4) != 0) {
            ReadPNM_cold_4();
            goto LAB_00107158;
          }
          local_8b8 = local_8b8 | 4;
          local_8d0._12_4_ = local_8ec;
        }
        else {
          iVar6 = __isoc99_sscanf(local_848,"MAXVAL %d",&local_8ec);
          if (iVar6 == 1) {
            if ((local_8b8 & 8) != 0) {
              ReadPNM_cold_3();
              goto LAB_00107158;
            }
            local_8b8 = local_8b8 | 8;
            local_8c0 = CONCAT44(local_8c0._4_4_,local_8ec);
          }
          else {
            auVar24[0] = -(local_848[3] == 'L');
            auVar24[1] = -(cStack_844 == 'T');
            auVar24[2] = -(cStack_843 == 'Y');
            auVar24[3] = -(cStack_842 == 'P');
            auVar24[4] = -(cStack_841 == 'E');
            auVar24[5] = -(cStack_840 == ' ');
            auVar24[6] = -(cStack_83f == 'R');
            auVar24[7] = -(cStack_83e == 'G');
            auVar24[8] = -(cStack_83d == 'B');
            auVar24[9] = -(cStack_83c == '_');
            auVar24[10] = -(cStack_83b == 'A');
            auVar24[0xb] = -(cStack_83a == 'L');
            auVar24[0xc] = -(cStack_839 == 'P');
            auVar24[0xd] = -(cStack_838 == 'H');
            auVar24[0xe] = -(cStack_837 == 'A');
            auVar24[0xf] = -(cStack_836 == '\0');
            auVar27[0] = -(local_848[0] == 'T');
            auVar27[1] = -(local_848[1] == 'U');
            auVar27[2] = -(local_848[2] == 'P');
            auVar27[3] = -(local_848[3] == 'L');
            auVar27[4] = -(cStack_844 == 'T');
            auVar27[5] = -(cStack_843 == 'Y');
            auVar27[6] = -(cStack_842 == 'P');
            auVar27[7] = -(cStack_841 == 'E');
            auVar27[8] = -(cStack_840 == ' ');
            auVar27[9] = -(cStack_83f == 'R');
            auVar27[10] = -(cStack_83e == 'G');
            auVar27[0xb] = -(cStack_83d == 'B');
            auVar27[0xc] = -(cStack_83c == '_');
            auVar27[0xd] = -(cStack_83b == 'A');
            auVar27[0xe] = -(cStack_83a == 'L');
            auVar27[0xf] = -(cStack_839 == 'P');
            auVar27 = auVar27 & auVar24;
            if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) {
              local_8b8 = local_8b8 | 0x10;
              local_8e8 = CONCAT44(local_8e8._4_4_,4);
            }
            else if (CONCAT17(cStack_83c,
                              CONCAT16(cStack_83d,
                                       CONCAT15(cStack_83e,
                                                CONCAT14(cStack_83f,
                                                         CONCAT13(cStack_840,
                                                                  CONCAT12(cStack_841,
                                                                           CONCAT11(cStack_842,
                                                                                    cStack_843))))))
                             ) == 0x42475220455059 &&
                     CONCAT17(cStack_841,
                              CONCAT16(cStack_842,
                                       CONCAT15(cStack_843,
                                                CONCAT14(cStack_844,
                                                         CONCAT13(local_848[3],
                                                                  CONCAT12(local_848[2],
                                                                           CONCAT11(local_848[1],
                                                                                    local_848[0]))))
                                               ))) == 0x455059544c505554) {
              local_8b8 = local_8b8 | 0x10;
              local_8e8 = CONCAT44(local_8e8._4_4_,3);
            }
            else {
              auVar25[0] = -(cStack_83f == 'G');
              auVar25[1] = -(cStack_83e == 'R');
              auVar25[2] = -(cStack_83d == 'A');
              auVar25[3] = -(cStack_83c == 'Y');
              auVar25[4] = -(cStack_83b == 'S');
              auVar25[5] = -(cStack_83a == 'C');
              auVar25[6] = -(cStack_839 == 'A');
              auVar25[7] = -(cStack_838 == 'L');
              auVar25[8] = -(cStack_837 == 'E');
              auVar25[9] = -(cStack_836 == '_');
              auVar25[10] = -(cStack_835 == 'A');
              auVar25[0xb] = -(cStack_834 == 'L');
              auVar25[0xc] = -(cStack_833 == 'P');
              auVar25[0xd] = -(cStack_832 == 'H');
              auVar25[0xe] = -(cStack_831 == 'A');
              auVar25[0xf] = -(cStack_830 == '\0');
              auVar28[0] = -(local_848[0] == 'T');
              auVar28[1] = -(local_848[1] == 'U');
              auVar28[2] = -(local_848[2] == 'P');
              auVar28[3] = -(local_848[3] == 'L');
              auVar28[4] = -(cStack_844 == 'T');
              auVar28[5] = -(cStack_843 == 'Y');
              auVar28[6] = -(cStack_842 == 'P');
              auVar28[7] = -(cStack_841 == 'E');
              auVar28[8] = -(cStack_840 == ' ');
              auVar28[9] = -(cStack_83f == 'G');
              auVar28[10] = -(cStack_83e == 'R');
              auVar28[0xb] = -(cStack_83d == 'A');
              auVar28[0xc] = -(cStack_83c == 'Y');
              auVar28[0xd] = -(cStack_83b == 'S');
              auVar28[0xe] = -(cStack_83a == 'C');
              auVar28[0xf] = -(cStack_839 == 'A');
              auVar28 = auVar28 & auVar25;
              if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
                local_8b8 = local_8b8 | 0x10;
                local_8e8 = CONCAT44(local_8e8._4_4_,2);
              }
              else {
                auVar26[0] = -(local_848[3] == 'L');
                auVar26[1] = -(cStack_844 == 'T');
                auVar26[2] = -(cStack_843 == 'Y');
                auVar26[3] = -(cStack_842 == 'P');
                auVar26[4] = -(cStack_841 == 'E');
                auVar26[5] = -(cStack_840 == ' ');
                auVar26[6] = -(cStack_83f == 'G');
                auVar26[7] = -(cStack_83e == 'R');
                auVar26[8] = -(cStack_83d == 'A');
                auVar26[9] = -(cStack_83c == 'Y');
                auVar26[10] = -(cStack_83b == 'S');
                auVar26[0xb] = -(cStack_83a == 'C');
                auVar26[0xc] = -(cStack_839 == 'A');
                auVar26[0xd] = -(cStack_838 == 'L');
                auVar26[0xe] = -(cStack_837 == 'E');
                auVar26[0xf] = -(cStack_836 == '\0');
                auVar29[0] = -(local_848[0] == local_888[0]);
                auVar29[1] = -(local_848[1] == local_888[1]);
                auVar29[2] = -(local_848[2] == local_888[2]);
                auVar29[3] = -(local_848[3] == local_888[3]);
                auVar29[4] = -(cStack_844 == local_888[4]);
                auVar29[5] = -(cStack_843 == local_888[5]);
                auVar29[6] = -(cStack_842 == local_888[6]);
                auVar29[7] = -(cStack_841 == local_888[7]);
                auVar29[8] = -(cStack_840 == local_888[8]);
                auVar29[9] = -(cStack_83f == local_888[9]);
                auVar29[10] = -(cStack_83e == local_888[10]);
                auVar29[0xb] = -(cStack_83d == local_888[0xb]);
                auVar29[0xc] = -(cStack_83c == local_888[0xc]);
                auVar29[0xd] = -(cStack_83b == local_888[0xd]);
                auVar29[0xe] = -(cStack_83a == local_888[0xe]);
                auVar29[0xf] = -(cStack_839 == local_888[0xf]);
                auVar29 = auVar29 & auVar26;
                if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff) {
                  if (CONCAT13(cStack_842,CONCAT12(cStack_843,CONCAT11(cStack_844,local_848[3]))) !=
                      0x524448 ||
                      CONCAT13(local_848[3],
                               CONCAT12(local_848[2],CONCAT11(local_848[1],local_848[0]))) !=
                      0x48444e45) {
                    ReadPNM_cold_1();
                    goto LAB_00107158;
                  }
                  if ((local_8b8 & 0xf) != 0) {
                    if (((int)local_8e8 != -1) && (local_8d0._12_4_ != (int)local_8e8)) {
                      off = 0;
                      fprintf(_stderr,"PAM header error: expected DEPTH %d but got DEPTH %d\n");
                    }
                    goto LAB_0010715d;
                  }
                  ReadPNM_cold_2();
                  goto LAB_00107158;
                }
                local_8b8 = local_8b8 | 0x10;
                local_8e8 = CONCAT44(local_8e8._4_4_,1);
              }
            }
          }
        }
      }
      goto LAB_00106982;
    }
    if ((local_8b8 & 1) == 0) {
      local_8b8 = local_8b8 | 1;
      local_8d0._0_4_ = local_8ec;
      goto LAB_00106982;
    }
    ReadPNM_cold_6();
LAB_00107158:
    off = 0;
LAB_0010715d:
    sVar16 = 0;
    if ((0 < (int)local_8d0._0_4_) && (0 < (int)local_8d0._4_4_)) {
      if ((local_8c0._4_4_ - 9U < 0xfffffff8) ||
         ((local_8d0._12_4_ - 5 < 0xfffffffc || ((uint)local_8c0 - 0x10000 < 0xffff0001))))
      goto LAB_00106cff;
      local_8d0._8_4_ = local_8d0._12_4_ << (0xff < (int)(uint)local_8c0);
      sVar16 = off;
    }
  }
  else {
    do {
      if (off < local_8d8) {
        local_8a8 = 0;
        do {
          uVar8 = local_8a8;
          uVar5 = local_8e0[uVar8 + off];
          local_438[uVar8] = uVar5;
          local_8a8 = uVar8;
          if ((uVar5 == '\n') || (local_8a8 = uVar8 + 1, 0x3fe < uVar8)) break;
        } while (off + 1 + uVar8 < local_8d8);
        off = off + uVar8 + 1;
      }
      else {
        local_8a8 = 0;
      }
    } while ((off < local_8d8) && ((local_8a8 == 0 || (local_438[0] == '#'))));
    local_438[local_8a8] = '\0';
    if (off != 0) {
      iVar6 = __isoc99_sscanf(local_438,"%d %d",local_8d0,local_8d0 + 4);
      if (((iVar6 != 2) ||
          (off = ReadLine(local_8e0,off,local_8d8,(char *)local_438,&local_8a8), off == 0)) ||
         (iVar6 = __isoc99_sscanf(local_438,"%d",&local_8c0), iVar6 != 1)) goto LAB_00106cff;
      local_8d0._12_4_ = (uint)(local_8c0._4_4_ != 5) * 2 + 1;
      goto LAB_0010715d;
    }
    sVar16 = 0;
  }
  goto LAB_00106d02;
}

Assistant:

int ReadPNM(const uint8_t* const data, size_t data_size,
            WebPPicture* const pic, int keep_alpha,
            struct Metadata* const metadata) {
  int ok = 0;
  int i, j;
  uint64_t stride, pixel_bytes, sample_size, depth;
  uint8_t* rgb = NULL, *tmp_rgb;
  size_t offset;
  PNMInfo info;

  info.data = data;
  info.data_size = data_size;
  offset = ReadHeader(&info);
  if (offset == 0) {
    fprintf(stderr, "Error parsing PNM header.\n");
    goto End;
  }

  if (info.type < 5 || info.type > 7) {
    fprintf(stderr, "Unsupported P%d PNM format.\n", info.type);
    goto End;
  }

  // Some basic validations.
  if (pic == NULL) goto End;
  if (info.width > WEBP_MAX_DIMENSION || info.height > WEBP_MAX_DIMENSION) {
    fprintf(stderr, "Invalid %dx%d dimension for PNM\n",
                    info.width, info.height);
    goto End;
  }

  pixel_bytes = (uint64_t)info.width * info.height * info.bytes_per_px;
  if (data_size < offset + pixel_bytes) {
    fprintf(stderr, "Truncated PNM file (P%d).\n", info.type);
    goto End;
  }
  sample_size = (info.max_value > 255) ? 2 : 1;
  // final depth
  depth = (info.depth == 1 || info.depth == 3 || !keep_alpha) ? 3 : 4;
  stride = depth * info.width;
  if (stride != (size_t)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, info.height)) {
    goto End;
  }

  rgb = (uint8_t*)malloc((size_t)stride * info.height);
  if (rgb == NULL) goto End;

  // Convert input.
  // We only optimize for the sample_size=1, max_value=255, depth=1 case.
  tmp_rgb = rgb;
  for (j = 0; j < info.height; ++j) {
    const uint8_t* in = data + offset;
    offset += info.bytes_per_px * info.width;
    assert(offset <= data_size);
    if (info.max_value == 255 && info.depth >= 3) {
      // RGB or RGBA
      if (info.depth == 3 || keep_alpha) {
        memcpy(tmp_rgb, in, info.depth * info.width * sizeof(*in));
      } else {
        assert(info.depth == 4 && !keep_alpha);
        for (i = 0; i < info.width; ++i) {
          tmp_rgb[3 * i + 0] = in[4 * i + 0];
          tmp_rgb[3 * i + 1] = in[4 * i + 1];
          tmp_rgb[3 * i + 2] = in[4 * i + 2];
        }
      }
    } else {
      // Unoptimized case, we need to handle non-trivial operations:
      //   * convert 16b to 8b (if max_value > 255)
      //   * rescale to [0..255] range (if max_value != 255)
      //   * drop the alpha channel (if keep_alpha is false)
      const uint32_t round = info.max_value / 2;
      int k = 0;
      for (i = 0; i < info.width * info.depth; ++i) {
        uint32_t v = (sample_size == 2) ? 256u * in[2 * i + 0] + in[2 * i + 1]
                   : in[i];
        if (info.max_value != 255) v = (v * 255u + round) / info.max_value;
        if (v > 255u) v = 255u;
        if (info.depth > 2) {
          if (!keep_alpha && info.depth == 4 && (i % 4) == 3) {
            // skip alpha
          } else {
            tmp_rgb[k] = v;
            k += 1;
          }
        } else if (info.depth == 1 || (i % 2) == 0) {
          tmp_rgb[k + 0] = tmp_rgb[k + 1] = tmp_rgb[k + 2] = v;
          k += 3;
        } else if (keep_alpha && info.depth == 2) {
          tmp_rgb[k] = v;
          k += 1;
        } else {
          // skip alpha
        }
      }
    }
    tmp_rgb += stride;
  }

  // WebP conversion.
  pic->width = info.width;
  pic->height = info.height;
  ok = (depth == 4) ? WebPPictureImportRGBA(pic, rgb, (int)stride)
                    : WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) goto End;

  ok = 1;
 End:
  free((void*)rgb);

  (void)metadata;
  (void)keep_alpha;
  return ok;
}